

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

BLOCK_SIZE
get_bsize(CommonModeInfoParams *mi_params,BLOCK_SIZE fp_block_size,int unit_row,int unit_col)

{
  byte bVar1;
  long lVar2;
  BLOCK_SIZE *pBVar3;
  int iVar4;
  int iVar5;
  undefined3 in_register_00000031;
  int iVar6;
  int in_R8D;
  long lVar7;
  
  iVar6 = CONCAT31(in_register_00000031,fp_block_size);
  iVar5 = (uint)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [(uint)unit_row] >> 1) +
          in_R8D * (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [(uint)unit_row];
  bVar1 = block_size_high[(uint)unit_row];
  if (block_size_high[(uint)unit_row] < block_size_wide[(uint)unit_row]) {
    bVar1 = block_size_wide[(uint)unit_row];
  }
  lVar7 = 0;
  if (bVar1 < 0x20) {
    if (bVar1 == 8) {
      lVar7 = 1;
    }
    else if (bVar1 == 0x10) {
      lVar7 = 2;
    }
  }
  else if (bVar1 == 0x20) {
    lVar7 = 3;
  }
  else if (bVar1 == 0x40) {
    lVar7 = 4;
  }
  else if (bVar1 == 0x80) {
    lVar7 = 5;
  }
  iVar4 = unit_col *
          (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [(uint)unit_row] +
          (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [(uint)unit_row] >> 1);
  if ((iVar5 < iVar6) && (iVar4 < (int)mi_params)) {
    return (BLOCK_SIZE)unit_row;
  }
  lVar2 = 0x12;
  if (iVar4 < (int)mi_params) {
    lVar2 = 0xc;
  }
  if (iVar5 < iVar6) {
    lVar2 = 0xc;
  }
  pBVar3 = (BLOCK_SIZE *)0x4e12c6;
  if (iVar6 <= iVar5) {
    pBVar3 = subsize_lookup[0] + lVar2;
  }
  return pBVar3[lVar7];
}

Assistant:

static BLOCK_SIZE get_bsize(const CommonModeInfoParams *const mi_params,
                            const BLOCK_SIZE fp_block_size, const int unit_row,
                            const int unit_col) {
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_height = mi_size_high[fp_block_size];
  const int is_half_width =
      unit_width * unit_col + unit_width / 2 >= mi_params->mi_cols;
  const int is_half_height =
      unit_height * unit_row + unit_height / 2 >= mi_params->mi_rows;
  const int max_dimension =
      AOMMAX(block_size_wide[fp_block_size], block_size_high[fp_block_size]);
  int square_block_size = 0;
  // 4X4, 8X8, 16X16, 32X32, 64X64, 128X128
  switch (max_dimension) {
    case 4: square_block_size = 0; break;
    case 8: square_block_size = 1; break;
    case 16: square_block_size = 2; break;
    case 32: square_block_size = 3; break;
    case 64: square_block_size = 4; break;
    case 128: square_block_size = 5; break;
    default: assert(0 && "First pass block size is not supported!"); break;
  }
  if (is_half_width && is_half_height) {
    return subsize_lookup[PARTITION_SPLIT][square_block_size];
  } else if (is_half_width) {
    return subsize_lookup[PARTITION_VERT][square_block_size];
  } else if (is_half_height) {
    return subsize_lookup[PARTITION_HORZ][square_block_size];
  } else {
    return fp_block_size;
  }
}